

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O0

ssize_t httplib::detail::read_socket(socket_t sock,void *ptr,size_t size,int flags)

{
  anon_class_32_4_210d28e3 fn;
  ssize_t sVar1;
  int local_24;
  size_t sStack_20;
  int flags_local;
  size_t size_local;
  void *ptr_local;
  socket_t sock_local;
  
  fn.ptr = (void **)&stack0xffffffffffffffe0;
  fn.sock = (socket_t *)&size_local;
  fn.size = (size_t *)&local_24;
  fn.flags = (int *)((long)&ptr_local + 4);
  local_24 = flags;
  sStack_20 = size;
  size_local = (size_t)ptr;
  ptr_local._4_4_ = sock;
  sVar1 = handle_EINTR<httplib::detail::read_socket(int,void*,unsigned_long,int)::_lambda()_1_>(fn);
  return sVar1;
}

Assistant:

inline ssize_t read_socket(socket_t sock, void *ptr, size_t size, int flags) {
  return handle_EINTR([&]() {
    return recv(sock,
#ifdef _WIN32
                static_cast<char *>(ptr), static_cast<int>(size),
#else
                ptr, size,
#endif
                flags);
  });
}